

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall mkvmuxer::Cues::~Cues(Cues *this)

{
  CuePoint *this_00;
  long lVar1;
  
  if (this->cue_entries_ != (CuePoint **)0x0) {
    if (0 < this->cue_entries_size_) {
      lVar1 = 0;
      do {
        this_00 = this->cue_entries_[lVar1];
        if (this_00 != (CuePoint *)0x0) {
          CuePoint::~CuePoint(this_00);
          operator_delete(this_00);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < this->cue_entries_size_);
    }
    if (this->cue_entries_ != (CuePoint **)0x0) {
      operator_delete__(this->cue_entries_);
      return;
    }
  }
  return;
}

Assistant:

Cues::~Cues() {
  if (cue_entries_) {
    for (int32_t i = 0; i < cue_entries_size_; ++i) {
      CuePoint* const cue = cue_entries_[i];
      delete cue;
    }
    delete[] cue_entries_;
  }
}